

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNode * __thiscall CConnman::FindNode(CConnman *this,CService *addr)

{
  pointer ppCVar1;
  bool bVar2;
  pointer ppCVar3;
  CNode *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> local_70;
  CService local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_70,&this->m_nodes_mutex,
             "m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x15e,false);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppCVar3 == ppCVar1) {
      pCVar4 = (CNode *)0x0;
      break;
    }
    pCVar4 = *ppCVar3;
    CService::CService(&local_60,&(pCVar4->addr).super_CService);
    bVar2 = ::operator==(&local_60,addr);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_60);
    ppCVar3 = ppCVar3 + 1;
  } while (!bVar2);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pCVar4;
}

Assistant:

CNode* CConnman::FindNode(const CService& addr)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (static_cast<CService>(pnode->addr) == addr) {
            return pnode;
        }
    }
    return nullptr;
}